

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

bool __thiscall QDateTimeEditPrivate::isSeparatorKey(QDateTimeEditPrivate *this,QKeyEvent *ke)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  Int IVar4;
  qsizetype qVar5;
  const_reference this_00;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff38;
  FieldInfoFlag in_stack_ffffffffffffff3c;
  QList<QString> *in_stack_ffffffffffffff40;
  undefined5 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  bool local_99;
  bool local_81;
  QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4> local_24;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  bVar2 = QString::isEmpty((QString *)0x55c3cf);
  local_99 = false;
  if (!bVar2) {
    iVar1 = *(int *)(in_RDI + 0x3e0);
    qVar5 = QList<QDateTimeParser::SectionNode>::size
                      ((QList<QDateTimeParser::SectionNode> *)(in_RDI + 0x408));
    local_99 = false;
    if (iVar1 + 1 < qVar5) {
      local_99 = -1 < *(int *)(in_RDI + 0x3e0);
    }
  }
  QString::~QString((QString *)0x55c43c);
  if ((local_99 & 1U) == 0) {
    local_81 = false;
  }
  else {
    QDateTimeParser::fieldInfo((int)in_RDI + 0x3d8);
    local_24.super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i =
         (QFlagsStorage<QDateTimeParser::FieldInfoFlag>)
         QFlags<QDateTimeParser::FieldInfoFlag>::operator&
                   ((QFlags<QDateTimeParser::FieldInfoFlag> *)in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff3c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    if (IVar4 == 0) {
      QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QString::at((QString *)
                  CONCAT17(local_99,CONCAT16(in_stack_ffffffffffffff4e,
                                             CONCAT15(in_stack_ffffffffffffff4d,
                                                      in_stack_ffffffffffffff48))),
                  (qsizetype)in_stack_ffffffffffffff40);
      bVar3 = QChar::isLetterOrNumber((QChar *)0x55c520);
      QString::~QString((QString *)0x55c52e);
      if ((bVar3 & 1) != 0) {
        local_81 = false;
        goto LAB_0055c5a4;
      }
    }
    else {
      QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QString::at((QString *)
                  CONCAT17(local_99,CONCAT16(in_stack_ffffffffffffff4e,
                                             CONCAT15(in_stack_ffffffffffffff4d,
                                                      in_stack_ffffffffffffff48))),
                  (qsizetype)in_stack_ffffffffffffff40);
      bVar3 = QChar::isNumber((QChar *)0x55c4cd);
      QString::~QString((QString *)0x55c4de);
      if ((bVar3 & 1) != 0) {
        local_81 = false;
        goto LAB_0055c5a4;
      }
    }
    this_00 = QList<QString>::at(in_stack_ffffffffffffff40,
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_81 = QString::contains(this_00,(QString *)
                                         CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),CaseInsensitive);
    QString::~QString((QString *)0x55c59d);
  }
LAB_0055c5a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool QDateTimeEditPrivate::isSeparatorKey(const QKeyEvent *ke) const
{
    if (!ke->text().isEmpty() && currentSectionIndex + 1 < sectionNodes.size() && currentSectionIndex >= 0) {
        if (fieldInfo(currentSectionIndex) & Numeric) {
            if (ke->text().at(0).isNumber())
                return false;
        } else if (ke->text().at(0).isLetterOrNumber()) {
            return false;
        }
        return separators.at(currentSectionIndex + 1).contains(ke->text());
    }
    return false;
}